

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed32Array
               (uint32_t *a,int n,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int n_local;
  uint32_t *a_local;
  
  WriteArray<unsigned_int>(a,n,output);
  return;
}

Assistant:

void WireFormatLite::WriteFixed32Array(const uint32_t* a, int n,
                                       io::CodedOutputStream* output) {
  WriteArray<uint32_t>(a, n, output);
}